

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Integer MA_sizeof_overhead(Integer datatype)

{
  long in_RDI;
  int i;
  int biggest_datatype;
  int max_sizeof;
  int ceiling;
  int overhead_bytes;
  int local_24;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  long local_8;
  
  iVar1 = 0;
  ma_stats.calls[0x1d] = ma_stats.calls[0x1d] + 1;
  ma_preinitialize((char *)0x1ad23f);
  if ((in_RDI < 1000) || (0x3f8 < in_RDI)) {
    sprintf(ma_ebuf,"invalid datatype: %ld",in_RDI);
    ma_error((ErrorLevel)((ulong)in_RDI >> 0x20),(ErrorType)in_RDI,
             (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             (char *)CONCAT44(in_stack_ffffffffffffffe4,iVar1));
    local_8 = 0;
  }
  else {
    iVar2 = 0;
    for (local_24 = 0; local_24 < 0x11; local_24 = local_24 + 1) {
      if (iVar2 < ma_sizeof[local_24]) {
        iVar2 = ma_sizeof[local_24];
        iVar1 = local_24;
      }
    }
    local_8 = (long)(int)((ma_sizeof[iVar1] + 0x5e) / ma_sizeof[in_RDI + -1000] +
                         (uint)((ma_sizeof[iVar1] + 0x5e) % ma_sizeof[in_RDI + -1000] != 0));
  }
  return local_8;
}

Assistant:

public Integer MA_sizeof_overhead(Integer datatype) 
{
    int        overhead_bytes;    /* max bytes of overhead for any block */
    int        ceiling;    /* 1 iff ceiling alters result */
    int        max_sizeof;    /* max over i of ma_sizeof[i] */
    int        biggest_datatype=0; /* corresponds to max_sizeof */
    int        i;        /* loop index */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_sizeof_overhead]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return DONTCARE;
#endif /* VERIFY */

    /* preinitialize if necessary */
    ma_preinitialize("MA_sizeof_overhead");

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Fatal, ET_External, "MA_sizeof_overhead", ma_ebuf);
        return DONTCARE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /* compute and return the result */
    for (max_sizeof = 0, i = 0; i < MT_NUMTYPES; i++)
        if (ma_sizeof[i] > max_sizeof)
        {
            max_sizeof = ma_sizeof[i];
            biggest_datatype = i;
        }
    overhead_bytes = max_block_overhead(biggest_datatype);
    ceiling = (overhead_bytes % ma_sizeof[datatype]) ? 1 : 0;
    return (Integer)((overhead_bytes / ma_sizeof[datatype]) + ceiling);
}